

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::ReprintFatalMessage(void)

{
  google *this;
  
  if (fatal_message != '\0') {
    this = (google *)strlen(&fatal_message);
    if (fLB::FLAGS_logtostderr == '\0') {
      ReprintFatalMessage(this);
    }
    LogDestination::LogToAllLogfiles(ERROR,(time_point *)&fatal_time,&fatal_message,(size_t)this);
    return;
  }
  return;
}

Assistant:

void ReprintFatalMessage() {
  if (fatal_message[0]) {
    const size_t n = strlen(fatal_message);
    if (!FLAGS_logtostderr) {
      // Also write to stderr (don't color to avoid terminal checks)
      WriteToStderr(fatal_message, n);
    }
    LogDestination::LogToAllLogfiles(GLOG_ERROR, fatal_time, fatal_message, n);
  }
}